

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O0

sexp_conflict json_read(sexp_conflict ctx,sexp_conflict self,sexp_conflict in)

{
  long lVar1;
  ushort **ppuVar2;
  sexp_conflict self_00;
  char *in_RDX;
  sexp_conflict in_RSI;
  sexp_conflict in_RDI;
  sexp_conflict unaff_retaddr;
  sexp_conflict in_stack_00000008;
  sexp_conflict in_stack_00000010;
  sexp_conflict in_stack_00000020;
  sexp_conflict in_stack_00000028;
  sexp_conflict in_stack_00000030;
  int ch;
  sexp_conflict res;
  sexp_conflict in_stack_000000a8;
  sexp_conflict in_stack_000000b0;
  sexp_conflict in_stack_000000b8;
  sexp_conflict in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  uint local_24;
  sexp_conflict local_20;
  
  local_24 = 0x20;
  while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)local_24] & 0x2000) != 0) {
    if (*(long *)(in_RDX + 0x28) == 0) {
      in_stack_ffffffffffffffd4 = getc(*(FILE **)(in_RDX + 0x20));
      local_24 = in_stack_ffffffffffffffd4;
    }
    else if (*(ulong *)(in_RDX + 0x38) < *(ulong *)(in_RDX + 0x50)) {
      lVar1 = *(long *)(in_RDX + 0x38);
      *(long *)(in_RDX + 0x38) = lVar1 + 1;
      in_stack_ffffffffffffffd4 = (uint)*(byte *)(*(long *)(in_RDX + 0x28) + lVar1);
      local_24 = in_stack_ffffffffffffffd4;
    }
    else {
      in_stack_ffffffffffffffd4 = sexp_buffered_read_char(in_RDI,in_RDX);
      local_24 = in_stack_ffffffffffffffd4;
    }
  }
  self_00 = (sexp_conflict)(ulong)(local_24 - 0x22);
  switch(self_00) {
  case (sexp_conflict)0x0:
    local_20 = json_read_string(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
    break;
  default:
    local_20 = sexp_json_read_exception
                         (in,res,(char *)in_stack_00000030,in_stack_00000028,in_stack_00000020);
    break;
  case (sexp_conflict)0x9:
  case (sexp_conflict)0xb:
  case (sexp_conflict)0xe:
  case (sexp_conflict)0xf:
  case (sexp_conflict)0x10:
  case (sexp_conflict)0x11:
  case (sexp_conflict)0x12:
  case (sexp_conflict)0x13:
  case (sexp_conflict)0x14:
  case (sexp_conflict)0x15:
  case (sexp_conflict)0x16:
  case (sexp_conflict)0x17:
    if (local_24 != 0xffffffff) {
      if (*(long *)(in_RDX + 0x28) == 0) {
        ungetc(local_24,*(FILE **)(in_RDX + 0x20));
      }
      else {
        lVar1 = *(long *)(in_RDX + 0x38);
        *(long *)(in_RDX + 0x38) = lVar1 + -1;
        *(char *)(*(long *)(in_RDX + 0x28) + -1 + lVar1) = (char)local_24;
      }
    }
    local_20 = json_read_number(in,res,in_stack_00000030);
    break;
  case (sexp_conflict)0x24:
  case (sexp_conflict)0x44:
    local_20 = json_read_literal((sexp_conflict)
                                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                 self_00,(sexp_conflict)
                                         CONCAT44(in_stack_ffffffffffffffc4,
                                                  in_stack_ffffffffffffffc0),
                                 in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    break;
  case (sexp_conflict)0x2c:
  case (sexp_conflict)0x4c:
    sexp_intern(in_RDI,"null",0xffffffffffffffff);
    local_20 = json_read_literal((sexp_conflict)
                                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                 self_00,(sexp_conflict)
                                         CONCAT44(in_stack_ffffffffffffffc4,
                                                  in_stack_ffffffffffffffc0),in_RDX,in_RSI);
    break;
  case (sexp_conflict)0x32:
  case (sexp_conflict)0x52:
    local_20 = json_read_literal((sexp_conflict)
                                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                 self_00,(sexp_conflict)
                                         CONCAT44(in_stack_ffffffffffffffc4,
                                                  in_stack_ffffffffffffffc0),
                                 in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    break;
  case (sexp_conflict)0x39:
    local_20 = json_read_array(unaff_retaddr,in_RDI,in_RSI);
    break;
  case (sexp_conflict)0x3b:
    local_20 = sexp_json_read_exception
                         (in,res,(char *)in_stack_00000030,in_stack_00000028,in_stack_00000020);
    break;
  case (sexp_conflict)0x59:
    local_20 = json_read_object(in_stack_00000010,in_stack_00000008,unaff_retaddr);
    break;
  case (sexp_conflict)0x5b:
    local_20 = sexp_json_read_exception
                         (in,res,(char *)in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  return local_20;
}

Assistant:

sexp json_read (sexp ctx, sexp self, sexp in) {
  sexp res;
  int ch = ' ';
  while (isspace(ch))
    ch = sexp_read_char(ctx, in);
  switch (ch) {
  case '{':
    res = json_read_object(ctx, self, in);
    break;
  case '[':
    res = json_read_array(ctx, self, in);
    break;
  case '"':
    res = json_read_string(ctx, self, in);
    break;
  case '-': case '+':
  case '0': case '1': case '2': case '3': case '4':
  case '5': case '6': case '7': case '8': case '9':
    sexp_push_char(ctx, ch, in);
    res = json_read_number(ctx, self, in);
    break;
  case 'n': case 'N':
    res = json_read_literal(ctx, self, in, "null", sexp_intern(ctx, "null", -1));
    break;
  case 't': case 'T':
    res = json_read_literal(ctx, self, in, "true", SEXP_TRUE);
    break;
  case 'f': case 'F':
    res = json_read_literal(ctx, self, in, "false", SEXP_FALSE);
    break;
  case '}':
    res = sexp_json_read_exception(ctx, self, "unexpected closing brace in json", in, SEXP_NULL);
    break;
  case ']':
    res = sexp_json_read_exception(ctx, self, "unexpected closing bracket in json", in, SEXP_NULL);
    break;
  default:
    res = sexp_json_read_exception(ctx, self, "unexpected character in json", in, sexp_make_character(ch));
    break;
  }
  return res;
}